

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7zStream.c
# Opt level: O2

SRes SeqInStream_Read(ISeqInStream *stream,void *buf,size_t size)

{
  SRes SVar1;
  
  SVar1 = SeqInStream_Read2(stream,buf,size,6);
  return SVar1;
}

Assistant:

SRes SeqInStream_Read(ISeqInStream *stream, void *buf, size_t size)
{
  return SeqInStream_Read2(stream, buf, size, SZ_ERROR_INPUT_EOF);
}